

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.cpp
# Opt level: O1

void __thiscall
gmlc::networking::TcpAcceptor::TcpAcceptor(TcpAcceptor *this,io_context *io_context,endpoint *ep)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int __oflag;
  int local_34;
  
  (this->super_enable_shared_from_this<gmlc::networking::TcpAcceptor>)._M_weak_this.
  super___weak_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<gmlc::networking::TcpAcceptor>)._M_weak_this.
  super___weak_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar1 = *(undefined8 *)((long)&(ep->impl_).data_ + 8);
  uVar2 = *(undefined8 *)((long)&(ep->impl_).data_ + 0xc);
  uVar3 = *(undefined8 *)((long)&(ep->impl_).data_ + 0x14);
  *(undefined8 *)&(this->endpoint_).impl_.data_ = *(undefined8 *)&(ep->impl_).data_;
  *(undefined8 *)((long)&(this->endpoint_).impl_.data_ + 8) = uVar1;
  *(undefined8 *)((long)&(this->endpoint_).impl_.data_ + 0xc) = uVar2;
  *(undefined8 *)((long)&(this->endpoint_).impl_.data_ + 0x14) = uVar3;
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  io_object_impl<asio::io_context>(&(this->acceptor_).impl_,0,0,io_context);
  (this->accepting).triggered._M_base._M_i = false;
  (this->accepting).activeLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->accepting).activeLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->accepting).activeLock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->accepting).activeLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->accepting).activeLock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)&(this->acceptCall).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->acceptCall).super__Function_base._M_functor + 8) = 0;
  (this->acceptCall).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->acceptCall)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->errorCall).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->errorCall).super__Function_base._M_functor + 8) = 0;
  (this->errorCall).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->errorCall)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->logFunction).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->logFunction).super__Function_base._M_functor + 8) = 0;
  (this->logFunction).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->logFunction)._M_invoker = (_Invoker_type)0x0;
  (this->state)._M_i = OPENED;
  (this->accepting).triggerLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->accepting).triggerLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->accepting).triggerLock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->accepting).triggerLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)
   ((long)&(this->accepting).triggerLock.super___mutex_base._M_mutex.__data.__list.__prev + 1) = 0;
  *(undefined8 *)
   ((long)&(this->accepting).triggerLock.super___mutex_base._M_mutex.__data.__list.__next + 1) = 0;
  std::condition_variable::condition_variable(&(this->accepting).cv_trigger);
  std::condition_variable::condition_variable(&(this->accepting).cv_active);
  local_34 = (uint)((ep->impl_).data_.base.sa_family != 2) * 8 + 2;
  asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::open
            (&this->acceptor_,(char *)&local_34,__oflag);
  return;
}

Assistant:

TcpAcceptor::TcpAcceptor(asio::io_context& io_context, tcp::endpoint& ep) :
    endpoint_(ep), acceptor_(io_context)
{
    acceptor_.open(ep.protocol());
}